

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::InitializeTransitions(BaseRockSample *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  reference this_00;
  State local_40 [8];
  State state;
  int local_20;
  int local_1c;
  int a;
  int s;
  int num_actions;
  int num_states;
  BaseRockSample *this_local;
  
  iVar1 = (**(code **)(*(long *)this + 0x10))();
  iVar2 = (**(code **)(*(long *)this + 0x18))();
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(&this->transition_probabilities_,(long)iVar1);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    pvVar3 = std::
             vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
             ::operator[](&this->transition_probabilities_,(long)local_1c);
    std::
    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
    ::resize(pvVar3,(long)iVar2);
    for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
      despot::State::State(local_40);
      NextState(this,local_1c,local_20);
      pvVar3 = std::
               vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ::operator[](&this->transition_probabilities_,(long)local_1c);
      this_00 = std::
                vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                ::operator[](pvVar3,(long)local_20);
      std::vector<despot::State,_std::allocator<despot::State>_>::push_back(this_00,local_40);
      despot::State::~State(local_40);
    }
  }
  return;
}

Assistant:

void BaseRockSample::InitializeTransitions() {
	int num_states = NumStates(), num_actions = NumActions();
	transition_probabilities_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		transition_probabilities_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			State state;
			state.state_id = NextState(s, a);
			state.weight = 1.0;
			transition_probabilities_[s][a].push_back(state);
		}
	}
}